

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Istream *this_00;
  Index index;
  uint uVar1;
  bool bVar2;
  Index IVar3;
  u32 val;
  Location local_a0;
  Var local_80;
  Enum local_38;
  Enum local_34;
  u32 local_30;
  u32 local_2c;
  Index keep_count;
  Index drop_count;
  FuncType *func_type;
  BinaryReaderInterp *pBStack_18;
  Index func_index_local;
  BinaryReaderInterp *this_local;
  
  func_type._4_4_ = func_index;
  pBStack_18 = this;
  _keep_count = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
                operator[](&this->func_types_,(ulong)func_index);
  local_34 = (Enum)GetReturnCallDropKeepCount(this,_keep_count,0,&local_2c,&local_30);
  bVar2 = Failed((Result)local_34);
  index = func_type._4_4_;
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Location::Location(&local_a0);
    Var::Var(&local_80,index,&local_a0);
    local_38 = (Enum)SharedValidator::OnReturnCall
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_80
                               );
    bVar2 = Failed((Result)local_38);
    Var::~Var(&local_80);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Istream::EmitDropKeep(this->istream_,local_2c,local_30);
      uVar1 = func_type._4_4_;
      IVar3 = num_func_imports(this);
      if (uVar1 < IVar3) {
        Istream::Emit(this->istream_,InterpCallImport,func_type._4_4_);
        Istream::Emit(this->istream_,Return);
      }
      else {
        this_00 = this->istream_;
        val = GetFuncOffset(this,func_type._4_4_);
        Istream::Emit(this_00,Br,val);
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallExpr(Index func_index) {
  FuncType& func_type = func_types_[func_index];

  Index drop_count, keep_count;
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, 0, &drop_count, &keep_count));
  // The validator must be run after we get the drop/keep counts, since it
  // will change the type stack.
  CHECK_RESULT(validator_.OnReturnCall(loc, Var(func_index)));
  istream_.EmitDropKeep(drop_count, keep_count);

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Br, GetFuncOffset(func_index));
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
    istream_.Emit(Opcode::Return);
  }

  return Result::Ok;
}